

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O1

bool dg::pta::PointerAnalysisFSInv::handleInvalidateLocals(PSNode *node,PSNode *pred)

{
  PSNode *target;
  _Base_ptr p_Var1;
  bool bVar2;
  MemoryObject *pMVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr *pp_Var5;
  mapped_type *this;
  long lVar6;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar7;
  byte bVar8;
  long lVar9;
  Pointer *ptr;
  bool bVar10;
  const_iterator __begin4;
  const_iterator local_88;
  MemoryMapT *local_70;
  _Base_ptr local_68;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  Pointer local_50;
  Pointer local_40;
  
  lVar6 = *(long *)(pred + 0x10);
  if (lVar6 != 0) {
    p_Var4 = *(_Rb_tree_node_base **)(lVar6 + 0x18);
    local_60 = (_Rb_tree_node_base *)(lVar6 + 8);
    if (p_Var4 != local_60) {
      local_70 = *(MemoryMapT **)(node + 0x10);
      bVar10 = false;
      do {
        target = *(PSNode **)(p_Var4 + 1);
        local_58 = p_Var4;
        if (((INVALIDATED != target) && (UNKNOWN_MEMORY != target)) && (NULLPTR != target)) {
          pMVar3 = getOrCreateMO(local_70,target);
          local_68 = p_Var4[1]._M_parent;
          for (p_Var4 = (pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            bVar2 = containsRemovableLocals(node,(PointsToSetT *)&p_Var4[1]._M_parent);
            if (bVar2) {
              replaceLocalsWithInv(node,(PointsToSetT *)&p_Var4[1]._M_parent);
              bVar10 = true;
            }
          }
          p_Var4 = *(_Rb_tree_node_base **)(local_68 + 1);
          pp_Var5 = &local_68->_M_left;
          if (p_Var4 != (_Rb_tree_node_base *)pp_Var5) {
            do {
              if (*(long *)(p_Var4 + 2) != 0) {
                this = std::
                       map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                       ::operator[](&pMVar3->pointsTo,(key_type *)(p_Var4 + 1));
                local_88.container_it.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                         p_Var4[1]._M_right;
                local_88.container_end.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                         (__node_type *)0x0;
                local_88.pos = 0;
                if (*(long *)(p_Var4 + 2) != 0) {
                  p_Var1 = *(_Base_ptr *)
                            ((long)&(((__node_type *)
                                     local_88.container_it.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ._M_cur)->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                    ._M_storage._M_storage + 8);
                  if (((ulong)p_Var1 & 1) == 0) {
                    local_88.pos = 0;
                    do {
                      if (local_88.pos == 0x3f) {
                        local_88.pos = 0x40;
                        break;
                      }
                      bVar8 = (byte)local_88.pos;
                      local_88.pos = local_88.pos + 1;
                    } while (((ulong)p_Var1 >> (bVar8 & 0x3f) & 2) == 0);
                  }
                  else {
                    local_88.pos = 0;
                  }
                }
                if (local_88.pos != 0 ||
                    local_88.container_it.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur != (__node_type *)0x0) {
                  do {
                    lVar6 = local_88.pos * 0x10 + llvm::DisableABIBreakingChecks;
                    lVar9 = (long)*(_Base_ptr *)
                                   ((long)local_88.container_it.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                          ._M_cur + 8) * 0x10;
                    local_50.target = *(PSNode **)(lVar9 + -0x10 + lVar6);
                    local_50.offset.offset = *(type *)(lVar9 + -8 + lVar6);
                    if ((((local_50.target == (PSNode *)0x0) ||
                         (*(int *)(local_50.target + 0x90) != 1)) ||
                        ((local_50.target[0xe9] != (PSNode)0x0 ||
                         ((local_50.target[0xea] != (PSNode)0x0 ||
                          (*(long *)(local_50.target + 0xa0) != *(long *)(node + 0xa0))))))) ||
                       ((*(PointerSubgraph **)(local_50.target + 0xa0) != (PointerSubgraph *)0x0 &&
                        (pvVar7 = PointerSubgraph::getLoop
                                            (*(PointerSubgraph **)(local_50.target + 0xa0),
                                             local_50.target),
                        pvVar7 != (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                                  0x0)))) {
                      ptr = &local_50;
                    }
                    else {
                      local_40.target = INVALIDATED;
                      local_40.offset.offset = 0;
                      ptr = &local_40;
                    }
                    bVar2 = PointerIdPointsToSet::add(this,ptr);
                    bVar10 = (bool)(bVar10 | bVar2);
                    ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++(&local_88);
                  } while (local_88.container_it.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                           ._M_cur != (__node_type *)0x0 || local_88.pos != 0);
                }
              }
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
            } while (p_Var4 != (_Rb_tree_node_base *)pp_Var5);
          }
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58);
        if (p_Var4 == local_60) {
          return bVar10;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static bool handleInvalidateLocals(PSNode *node, PSNode *pred) {
        MemoryMapT *pmm = pred->getData<MemoryMapT>();
        if (!pmm) {
            // predecessor was not processed yet
            return false;
        }

        MemoryMapT *mm = node->getData<MemoryMapT>();
        assert(mm && "Node does not have a memory map");

        bool changed = false;
        for (auto &I : *pmm) {
            if (isInvalidTarget(I.first))
                continue;

            // get or create a memory object for this target

            MemoryObject *mo = getOrCreateMO(mm, I.first);
            MemoryObject *pmo = I.second.get();

            for (auto &it : *mo) {
                // remove pointers to locals from the points-to set
                if (containsRemovableLocals(node, it.second)) {
                    replaceLocalsWithInv(node, it.second);
                    assert(!containsRemovableLocals(node, it.second));
                    changed = true;
                }
            }

            for (auto &it : *pmo) {
                PointsToSetT &predS = it.second;
                if (predS.empty())
                    continue;

                PointsToSetT &S = mo->pointsTo[it.first];

                // merge pointers from the previous states
                // but do not include the pointers
                // that _must_ point to destroyed memory
                for (const auto &ptr : predS) {
                    PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target);
                    if (alloc && isLocal(alloc, node) && knownInstance(alloc)) {
                        changed |= S.add(INVALIDATED, 0);
                    } else
                        changed |= S.add(ptr);
                }

                assert(!S.empty());
            }
        }

        return changed;
    }